

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O1

void sample_output<trng::lagfib2plus<unsigned_long,9842u,19937u>>
               (lagfib2plus<unsigned_long,_9842U,_19937U> *r,string *name)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  char local_2a [2];
  
  uVar2 = name->_M_string_length;
  while (uVar2 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar2 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar2);
  iVar5 = 0xf;
  do {
    uVar1 = (r->S).index;
    uVar4 = uVar1 + 1 & 0x7fff;
    (r->S).index = uVar4;
    (r->S).r[uVar4] = (r->S).r[uVar1 + 0x3220 & 0x7fff] + (r->S).r[uVar1 + 0x598f & 0x7fff];
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_2a[0] = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar1 = (r->S).index;
  uVar4 = uVar1 + 1 & 0x7fff;
  (r->S).index = uVar4;
  (r->S).r[uVar4] = (r->S).r[uVar1 + 0x3220 & 0x7fff] + (r->S).r[uVar1 + 0x598f & 0x7fff];
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_2a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a + 1,1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}